

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O3

string * __thiscall
google::protobuf::internal::GetTypeUrl_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,string_view message_name,
          string_view type_url_prefix)

{
  AlphaNum local_98;
  char *local_68;
  size_t local_60;
  AlphaNum local_38;
  
  local_60 = type_url_prefix._M_len;
  local_68 = message_name._M_str;
  local_38.piece_._M_str = (char *)message_name._M_len;
  if ((local_68 == (char *)0x0) || (local_68[local_60 - 1] != '/')) {
    local_98.piece_._M_len = 1;
    local_98.piece_._M_str = "/";
    local_38.piece_._M_len = (size_t)this;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_68,&local_98,&local_38,&local_98);
  }
  else {
    local_98.piece_._M_len = (size_t)this;
    local_98.piece_._M_str = local_38.piece_._M_str;
    absl::lts_20250127::StrCat_abi_cxx11_
              (__return_storage_ptr__,(lts_20250127 *)&local_68,&local_98,&local_98);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetTypeUrl(absl::string_view message_name,
                       absl::string_view type_url_prefix) {
  if (!type_url_prefix.empty() &&
      type_url_prefix[type_url_prefix.size() - 1] == '/') {
    return absl::StrCat(type_url_prefix, message_name);
  } else {
    return absl::StrCat(type_url_prefix, "/", message_name);
  }
}